

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void erase_lots(Terminal *term,_Bool line_only,_Bool from_begin,_Bool to_end)

{
  bool bVar1;
  wchar_t y;
  wchar_t wVar2;
  wchar_t wVar3;
  pos pVar4;
  termline *line;
  wchar_t wVar5;
  undefined7 in_register_00000031;
  wchar_t wVar6;
  wchar_t y_00;
  bool bVar7;
  bool bVar8;
  
  if ((int)CONCAT71(in_register_00000031,line_only) == 0) {
    wVar3 = term->rows;
    y_00 = L'\0';
  }
  else {
    y_00 = (term->curs).y;
    wVar3 = y_00 + L'\x01';
  }
  pVar4 = term->curs;
  wVar2 = pVar4.x;
  wVar5 = L'\0';
  if (from_begin) {
    wVar6 = L'\0';
  }
  else {
    y_00 = pVar4.y;
    wVar6 = wVar2;
    if (term->wrapnext == true) {
      wVar6 = wVar2 + L'\x01';
      bVar7 = term->cols == wVar2;
      wVar2 = L'\0';
      if (!bVar7) {
        wVar2 = wVar6;
      }
      y_00 = (uint)bVar7 + y_00;
      pVar4.x = L'\0';
      pVar4.y = y_00;
      wVar6 = wVar2;
    }
  }
  y = pVar4.y;
  if (!to_end) {
    bVar7 = wVar2 == term->cols;
    wVar5 = L'\0';
    if (!bVar7) {
      wVar5 = wVar2 + L'\x01';
    }
    y = y + (uint)bVar7;
    wVar3 = y;
    wVar2 = wVar5;
  }
  if (!from_begin || !to_end) {
    check_boundary(term,wVar2,y);
  }
  wVar2 = (term->selend).y;
  bVar7 = wVar6 < (term->selend).x;
  if (y_00 != wVar2) {
    bVar7 = y_00 < wVar2;
  }
  if (bVar7) {
    wVar2 = (term->selstart).y;
    bVar7 = (term->selstart).x < wVar5;
    if (wVar3 != wVar2) {
      bVar7 = wVar2 < wVar3;
    }
    if (bVar7) {
      term->selstate = LEXICOGRAPHIC;
      (term->selstart).y = L'\0';
      (term->selstart).x = L'\0';
      (term->selend).y = L'\0';
      (term->selend).x = L'\0';
    }
  }
  bVar7 = y_00 == L'\0';
  bVar1 = wVar6 == L'\0';
  if ((bVar7 && bVar1) && (wVar3 == term->rows)) {
    term_invalidate(term);
  }
  if ((!line_only && ((bVar7 && bVar1) && wVar5 == L'\0')) && (term->erase_to_scrollback != false))
  {
    if (wVar3 == term->rows) {
      wVar3 = find_last_nonempty_line(term,term->screen);
      wVar3 = wVar3 + L'\x01';
    }
    if (L'\0' < wVar3) {
      scroll(term,L'\0',wVar3 + L'\xffffffff',wVar3,true);
    }
  }
  else {
    line = lineptr(term,y_00,L'ହ',L'\x01');
    if (line->trusted != term->trusted) {
      clear_line(term,line);
      line->trusted = term->trusted;
    }
    bVar8 = y_00 < wVar3;
    if (y_00 == wVar3) {
      bVar8 = wVar6 < wVar5;
    }
    if (bVar8) {
      do {
        if (term->cols != line->cols) {
          resizeline(term,line,term->cols);
        }
        if (wVar6 == term->cols) {
          if (line_only) {
            *(byte *)&line->lattr = (byte)line->lattr & 0xcf;
          }
          else {
            line->lattr = 0;
          }
        }
        else {
          copy_termchar(line,wVar6,&term->erase_char);
        }
        y_00 = y_00 + (uint)(wVar6 == term->cols);
        bVar8 = wVar6 == term->cols;
        wVar6 = wVar6 + L'\x01';
        if (((bVar8) && (wVar6 = L'\0', y_00 < term->rows)) &&
           (line = lineptr(term,y_00,L'୆',L'\x01'), line->trusted != term->trusted)) {
          clear_line(term,line);
          line->trusted = term->trusted;
        }
        bVar8 = y_00 < wVar3;
        if (y_00 == wVar3) {
          bVar8 = wVar6 < wVar5;
        }
      } while (bVar8);
    }
  }
  if ((!line_only && ((bVar7 && bVar1) && wVar5 == L'\0')) && (term->alt_which == L'\0')) {
    term->tempsblines = L'\0';
  }
  return;
}

Assistant:

static void erase_lots(Terminal *term,
                       bool line_only, bool from_begin, bool to_end)
{
    pos start, end;
    bool erase_lattr;
    bool erasing_lines_from_top = false;

    if (line_only) {
        start.y = term->curs.y;
        start.x = 0;
        end.y = term->curs.y + 1;
        end.x = 0;
        erase_lattr = false;
    } else {
        start.y = 0;
        start.x = 0;
        end.y = term->rows;
        end.x = 0;
        erase_lattr = true;
    }

    /* This is the endpoint of the clearing operation that is not
     * either the start or end of the line / screen. */
    pos boundary = term->curs;

    if (!from_begin) {
        /*
         * If we're erasing from the current char to the end of
         * line/screen, then we take account of wrapnext, so as to
         * maintain the invariant that writing a printing character
         * followed by ESC[K should not overwrite the character you
         * _just wrote_. That is, when wrapnext says the cursor is
         * 'logically' at the very rightmost edge of the screen
         * instead of just before the last printing char, ESC[K should
         * do nothing at all, and ESC[J should clear the next line but
         * leave this one unchanged.
         *
         * This adjusted position will also be the position we use for
         * check_boundary (i.e. the thing we ensure isn't in the
         * middle of a double-width printing char).
         */
        if (term->wrapnext)
            incpos(boundary);

        start = boundary;
    }
    if (!to_end) {
        /*
         * If we're erasing from the start of (at least) the line _to_
         * the current position, then that is taken to mean 'inclusive
         * of the cell under the cursor', which means we don't
         * consider wrapnext at all: whether it's set or not, we still
         * clear the cell under the cursor.
         *
         * Again, that incremented boundary position is where we
         * should be careful of a straddling wide character.
         */
        incpos(boundary);
        end = boundary;
    }
    if (!from_begin || !to_end)
        check_boundary(term, boundary.x, boundary.y);
    check_selection(term, start, end);

    /* Clear screen also forces a full window redraw, just in case. */
    if (start.y == 0 && start.x == 0 && end.y == term->rows)
        term_invalidate(term);

    /* Lines scrolled away shouldn't be brought back on if the terminal
     * resizes. */
    if (start.y == 0 && start.x == 0 && end.x == 0 && erase_lattr)
        erasing_lines_from_top = true;

    if (term->erase_to_scrollback && erasing_lines_from_top) {
        /* If it's a whole number of lines, starting at the top, and
         * we're fully erasing them, erase by scrolling and keep the
         * lines in the scrollback. */
        int scrolllines = end.y;
        if (end.y == term->rows) {
            /* Shrink until we find a non-empty row.*/
            scrolllines = find_last_nonempty_line(term, term->screen) + 1;
        }
        if (scrolllines > 0)
            scroll(term, 0, scrolllines - 1, scrolllines, true);
    } else {
        termline *ldata = scrlineptr(start.y);
        check_trust_status(term, ldata);
        while (poslt(start, end)) {
            check_line_size(term, ldata);
            if (start.x == term->cols) {
                if (!erase_lattr)
                    ldata->lattr &= ~(LATTR_WRAPPED | LATTR_WRAPPED2);
                else
                    ldata->lattr = LATTR_NORM;
            } else {
                copy_termchar(ldata, start.x, &term->erase_char);
            }
            if (incpos(start) && start.y < term->rows) {
                ldata = scrlineptr(start.y);
                check_trust_status(term, ldata);
            }
        }
    }

    /* After an erase of lines from the top of the screen, we shouldn't
     * bring the lines back again if the terminal enlarges (since the user or
     * application has explicitly thrown them away). */
    if (erasing_lines_from_top && !(term->alt_which))
        term->tempsblines = 0;
}